

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O0

bool woff2::ConvertTTFToWOFF2
               (uint8_t *data,size_t length,uint8_t *result,size_t *result_length,
               WOFF2Params *params)

{
  allocator<unsigned_char> *paVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t *psVar5;
  Table *pTVar6;
  Table *pTVar7;
  mapped_type *this;
  uchar *puVar8;
  reference pvVar9;
  ulong __n;
  long lVar10;
  uint8_t *puVar11;
  size_t sVar12;
  reference puVar13;
  reference pvVar14;
  size_type sVar15;
  reference table_00;
  reference pFVar16;
  reference ppVar17;
  mapped_type_conflict *pmVar18;
  uint32_t local_4c8;
  uint32_t local_4c0;
  iterator iStack_3c0;
  uint16_t index;
  _Self local_3b8;
  pair<unsigned_int,_unsigned_int> local_3b0;
  pair<unsigned_int,_unsigned_int> tag_offset_1;
  uint32_t table_length;
  uint32_t table_offset;
  Table *table_3;
  pair<const_unsigned_int,_woff2::Font::Table> *entry_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range3_1;
  Table *table_2;
  pair<const_unsigned_int,_woff2::Font::Table> *entry;
  const_iterator __end3;
  const_iterator __begin3;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range3;
  uint16_t num_tables;
  Font *font_4;
  iterator __end2_3;
  iterator __begin2_3;
  vector<woff2::Font,_std::allocator<woff2::Font>_> *__range2_3;
  Table *table_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<woff2::Table,_std::allocator<woff2::Table>_> *__range1_3;
  size_t offset;
  size_t local_2d0;
  size_t woff2_length;
  Table *transformed_table;
  uint8_t *transformed_data;
  Table table;
  _Self local_288;
  pair<unsigned_int,_unsigned_int> local_280;
  pair<unsigned_int,_unsigned_int> tag_offset;
  Table *src_table;
  iterator iStack_268;
  uint tag_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_2;
  Font *font_3;
  iterator __end1_2;
  iterator __begin1_2;
  vector<woff2::Font,_std::allocator<woff2::Font>_> *__range1_2;
  map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  index_by_tag_offset;
  vector<woff2::Table,_std::allocator<woff2::Table>_> tables;
  undefined1 local_1c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_metadata_buf;
  Table *pTStack_1a8;
  uint32_t compressed_metadata_buf_length;
  Table *table_to_store;
  Table *original;
  iterator iStack_190;
  uint tag;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  Font *font_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<woff2::Font,_std::allocator<woff2::Font>_> *__range1_1;
  size_t transform_offset;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_buf;
  uint32_t total_compressed_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compression_buf;
  size_t compression_buffer_size;
  Font *font_1;
  iterator __end1;
  iterator __begin1;
  vector<woff2::Font,_std::allocator<woff2::Font>_> *__range1;
  size_t total_transform_length;
  Table *loca_table;
  Table *glyf_table;
  Font *font;
  iterator __end2;
  iterator __begin2;
  vector<woff2::Font,_std::allocator<woff2::Font>_> *__range2;
  undefined1 local_88 [8];
  FontCollection font_collection;
  WOFF2Params *params_local;
  size_t *result_length_local;
  uint8_t *result_local;
  size_t length_local;
  uint8_t *data_local;
  
  font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)params;
  FontCollection::FontCollection((FontCollection *)local_88);
  bVar3 = ReadFontCollection(data,length,(FontCollection *)local_88);
  if (!bVar3) {
    fprintf(_stderr,"Parsing of the input font failed.\n");
    data_local._7_1_ = 0;
    goto LAB_00138b18;
  }
  bVar3 = NormalizeFontCollection((FontCollection *)local_88);
  if (!bVar3) {
    data_local._7_1_ = 0;
    goto LAB_00138b18;
  }
  if ((((ulong)((font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->tables)._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left & 0x100000000) != 0) &&
     (bVar3 = TransformFontCollection((FontCollection *)local_88), !bVar3)) {
    data_local._7_1_ = 0;
    goto LAB_00138b18;
  }
  psVar5 = &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                     ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  font = (Font *)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::end
                           ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                                     *)&font), bVar3) {
    pFVar16 = __gnu_cxx::
              __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
              ::operator*(&__end2);
    pTVar6 = Font::FindTable(pFVar16,0x676c7966);
    pTVar7 = Font::FindTable(pFVar16,0x6c6f6361);
    if (pTVar6 != (Table *)0x0) {
      pTVar6->flag_byte = pTVar6->flag_byte | 0xc0;
    }
    if (pTVar7 != (Table *)0x0) {
      pTVar7->flag_byte = pTVar7->flag_byte | 0xc0;
    }
    __gnu_cxx::
    __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>::
    operator++(&__end2);
  }
  __range1 = (vector<woff2::Font,_std::allocator<woff2::Font>_> *)0x0;
  psVar5 = &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                     ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  font_1 = (Font *)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::end
                             ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                                     *)&font_1), bVar3) {
    pFVar16 = __gnu_cxx::
              __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
              ::operator*(&__end1);
    sVar12 = anon_unknown_0::ComputeTotalTransformLength(pFVar16);
    __range1 = (vector<woff2::Font,_std::allocator<woff2::Font>_> *)
               ((long)&(__range1->super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar12);
    __gnu_cxx::
    __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>::
    operator++(&__end1);
  }
  uVar4 = CompressedBufferSize((uint32_t)__range1);
  paVar1 = (allocator<unsigned_char> *)
           ((long)&transform_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  compression_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar4;
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_compressed_length,
             (size_type)(ulong)uVar4,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&transform_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  transform_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       (uint)compression_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&transform_offset + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,(size_type)__range1,
             (allocator<unsigned_char> *)((long)&transform_offset + 7));
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&transform_offset + 7));
  __range1_1 = (vector<woff2::Font,_std::allocator<woff2::Font>_> *)0x0;
  psVar5 = &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_1 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                       ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  font_2 = (Font *)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::end
                             ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                             *)&font_2), bVar3) {
    pFVar16 = __gnu_cxx::
              __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
              ::operator*(&__end1_1);
    Font::OutputOrderedTags
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1,pFVar16);
    __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    iStack_190 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffe70), bVar3) {
      puVar13 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end2_1);
      original._4_4_ = *puVar13;
      this = std::
             map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
             ::at(&pFVar16->tables,(key_type *)((long)&original + 4));
      bVar3 = Font::Table::IsReused(this);
      if ((!bVar3) && ((original._4_4_ & 0x80808080) == 0)) {
        pTStack_1a8 = Font::FindTable(pFVar16,original._4_4_ ^ 0x80808080);
        if (pTStack_1a8 == (Table *)0x0) {
          pTStack_1a8 = this;
        }
        puVar11 = pTStack_1a8->data;
        uVar2 = pTStack_1a8->length;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,0);
        StoreBytes(puVar11,(ulong)uVar2,(size_t *)&__range1_1,pvVar9);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2_1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    __gnu_cxx::
    __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>::
    operator++(&__end1_1);
  }
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &total_compressed_length,0);
  bVar3 = anon_unknown_0::Woff2Compress
                    (puVar8,(size_t)__range1,pvVar9,
                     (uint32_t *)
                     &transform_buf.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     *(int *)&((font_collection.fonts.
                                super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->tables)._M_t.
                              _M_impl.super__Rb_tree_header._M_header._M_left);
  if (bVar3) {
    fprintf(_stderr,"Compressed %zu to %u.\n",__range1,
            (ulong)(uint)transform_buf.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    uVar4 = std::__cxx11::string::length();
    compressed_metadata_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = CompressedBufferSize(uVar4);
    __n = (ulong)compressed_metadata_buf.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_char>::allocator(paVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,__n,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    lVar10 = std::__cxx11::string::length();
    if (lVar10 == 0) {
      compressed_metadata_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_00137f2d:
      std::vector<woff2::Table,_std::allocator<woff2::Table>_>::vector
                ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                 &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
      ::map((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
             *)&__range1_2);
      psVar5 = &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end1_2 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                           ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
      font_3 = (Font *)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::end
                                 ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                                 *)&font_3), bVar3) {
        pFVar16 = __gnu_cxx::
                  __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                  ::operator*(&__end1_2);
        Font::OutputOrderedTags
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_2,pFVar16);
        __end2_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_2);
        iStack_268 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_2);
        while (bVar3 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffd98), bVar3) {
          puVar13 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&__end2_2);
          src_table._4_4_ = *puVar13;
          tag_offset = (pair<unsigned_int,_unsigned_int>)
                       std::
                       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                       ::at(&pFVar16->tables,(key_type *)((long)&src_table + 4));
          bVar3 = Font::Table::IsReused((Table *)tag_offset);
          if (!bVar3) {
            std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                      (&local_280,(uint *)tag_offset,(uint *)((long)tag_offset + 8));
            local_288._M_node =
                 (_Base_ptr)
                 std::
                 map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                 ::find((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                         *)&__range1_2,&local_280);
            table.dst_data =
                 (uint8_t *)
                 std::
                 map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                 ::end((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                        *)&__range1_2);
            bVar3 = std::operator==(&local_288,(_Self *)&table.dst_data);
            if (!bVar3) {
              data_local._7_1_ = 0;
              __range2._0_4_ = 1;
              goto LAB_0013827a;
            }
            sVar15 = std::vector<woff2::Table,_std::allocator<woff2::Table>_>::size
                               ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                                &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
            pmVar18 = std::
                      map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                      ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                    *)&__range1_2,&local_280);
            *pmVar18 = (mapped_type_conflict)sVar15;
            transformed_data._0_4_ = *(undefined4 *)tag_offset;
            transformed_data._4_4_ = (uint)*(byte *)((long)tag_offset + 0x38);
            table.flags = *(uint32_t *)((long)tag_offset + 0xc);
            table.src_offset = *(uint32_t *)((long)tag_offset + 0xc);
            transformed_table = *(Table **)((long)tag_offset + 0x10);
            woff2_length = (size_t)Font::FindTable(pFVar16,*(uint *)tag_offset ^ 0x80808080);
            if ((Table *)woff2_length != (Table *)0x0) {
              transformed_data._4_4_ = ((Table *)woff2_length)->flag_byte | 0x100;
              table.src_offset = ((Table *)woff2_length)->length;
              transformed_table = (Table *)((Table *)woff2_length)->data;
            }
            std::vector<woff2::Table,_std::allocator<woff2::Table>_>::push_back
                      ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                       &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)&transformed_data);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end2_2);
        }
        __range2._0_4_ = 0xc;
LAB_0013827a:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_2);
        if ((int)__range2 != 0xc) goto LAB_00138a94;
        __gnu_cxx::
        __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>::
        operator++(&__end1_2);
      }
      std::
      map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
      ::map((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
             *)&offset,
            (map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
             *)&__range1_2);
      sVar12 = anon_unknown_0::ComputeWoff2Length
                         ((FontCollection *)local_88,
                          (vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                          &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                           *)&offset,
                          (ulong)(uint)transform_buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)compressed_metadata_buf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::
      map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
      ::~map((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
              *)&offset);
      local_2d0 = sVar12;
      if (*result_length < sVar12) {
        fprintf(_stderr,"Result allocation was too small (%zd vs %zd bytes).\n",*result_length,
                sVar12);
        data_local._7_1_ = 0;
      }
      else {
        *result_length = sVar12;
        __range1_3 = (vector<woff2::Table,_std::allocator<woff2::Table>_> *)0x0;
        StoreU32(0x774f4632,(size_t *)&__range1_3,result);
        if (local_88._0_4_ == 0x74746366) {
          StoreU32(0x74746366,(size_t *)&__range1_3,result);
        }
        else {
          pvVar14 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::operator[]
                              ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)
                               &font_collection.tables._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,0);
          StoreU32(pvVar14->flavor,(size_t *)&__range1_3,result);
        }
        StoreU32((uint32_t)local_2d0,(size_t *)&__range1_3,result);
        sVar15 = std::vector<woff2::Table,_std::allocator<woff2::Table>_>::size
                           ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                            &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Store16((int)sVar15,(size_t *)&__range1_3,result);
        Store16(0,(size_t *)&__range1_3,result);
        sVar12 = anon_unknown_0::ComputeUncompressedLength((FontCollection *)local_88);
        StoreU32((uint32_t)sVar12,(size_t *)&__range1_3,result);
        StoreU32((uint)transform_buf.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(size_t *)&__range1_3,result);
        Store16(1,(size_t *)&__range1_3,result);
        Store16(0,(size_t *)&__range1_3,result);
        if (compressed_metadata_buf.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          StoreU32(0,(size_t *)&__range1_3,result);
          StoreU32(0,(size_t *)&__range1_3,result);
          StoreU32(0,(size_t *)&__range1_3,result);
        }
        else {
          StoreU32((uint32_t)local_2d0 -
                   compressed_metadata_buf.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,(size_t *)&__range1_3,result);
          StoreU32(compressed_metadata_buf.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,(size_t *)&__range1_3,result);
          uVar4 = std::__cxx11::string::length();
          StoreU32(uVar4,(size_t *)&__range1_3,result);
        }
        StoreU32(0,(size_t *)&__range1_3,result);
        StoreU32(0,(size_t *)&__range1_3,result);
        psVar5 = &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1_3 = std::vector<woff2::Table,_std::allocator<woff2::Table>_>::begin
                             ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)psVar5);
        table_1 = (Table *)std::vector<woff2::Table,_std::allocator<woff2::Table>_>::end
                                     ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)psVar5)
        ;
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1_3,
                                  (__normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>
                                   *)&table_1), bVar3) {
          table_00 = __gnu_cxx::
                     __normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>
                     ::operator*(&__end1_3);
          anon_unknown_0::StoreTableEntry(table_00,(size_t *)&__range1_3,result);
          __gnu_cxx::
          __normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>
          ::operator++(&__end1_3);
        }
        if (local_88._0_4_ == 0x74746366) {
          StoreU32(local_88._4_4_,(size_t *)&__range1_3,result);
          sVar15 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::size
                             ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)
                              &font_collection.tables._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
          woff2::Store255UShort((int)sVar15,(ulong *)&__range1_3,result);
          psVar5 = &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count;
          __end2_3 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                               ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
          font_4 = (Font *)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::end
                                     ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)psVar5);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2_3,
                                    (__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                                     *)&font_4), bVar3) {
            pFVar16 = __gnu_cxx::
                      __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                      ::operator*(&__end2_3);
            __range3._6_2_ = 0;
            __end3 = std::
                     map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                     ::begin(&pFVar16->tables);
            entry = (pair<const_unsigned_int,_woff2::Font::Table> *)
                    std::
                    map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                    ::end(&pFVar16->tables);
            while (bVar3 = std::operator!=(&__end3,(_Self *)&entry), bVar3) {
              ppVar17 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>
                        ::operator*(&__end3);
              if (((ppVar17->second).tag & 0x80808080) == 0) {
                __range3._6_2_ = __range3._6_2_ + 1;
              }
              std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
              operator++(&__end3);
            }
            woff2::Store255UShort((uint)__range3._6_2_,(ulong *)&__range1_3,result);
            StoreU32(pFVar16->flavor,(size_t *)&__range1_3,result);
            __end3_1 = std::
                       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                       ::begin(&pFVar16->tables);
            entry_1 = (pair<const_unsigned_int,_woff2::Font::Table> *)
                      std::
                      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                      ::end(&pFVar16->tables);
            while (bVar3 = std::operator!=(&__end3_1,(_Self *)&entry_1), bVar3) {
              ppVar17 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>
                        ::operator*(&__end3_1);
              pTVar6 = &ppVar17->second;
              if ((pTVar6->tag & 0x80808080) == 0) {
                bVar3 = Font::Table::IsReused(pTVar6);
                if (bVar3) {
                  local_4c0 = ((ppVar17->second).reuse_of)->offset;
                }
                else {
                  local_4c0 = (ppVar17->second).offset;
                }
                tag_offset_1.second = local_4c0;
                bVar3 = Font::Table::IsReused(pTVar6);
                if (bVar3) {
                  local_4c8 = ((ppVar17->second).reuse_of)->length;
                }
                else {
                  local_4c8 = (ppVar17->second).length;
                }
                tag_offset_1.first = local_4c8;
                std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_true>
                          (&local_3b0,&pTVar6->tag,&tag_offset_1.second);
                local_3b8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                     ::find((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             *)&__range1_2,&local_3b0);
                iStack_3c0 = std::
                             map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             ::end((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                    *)&__range1_2);
                bVar3 = std::operator==(&local_3b8,&stack0xfffffffffffffc40);
                if (bVar3) {
                  fprintf(_stderr,"Missing table index for offset 0x%08x\n",
                          (ulong)tag_offset_1.second);
                  data_local._7_1_ = 0;
                  goto LAB_00138a94;
                }
                pmVar18 = std::
                          map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                          ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                        *)&__range1_2,&local_3b0);
                woff2::Store255UShort((uint)*pmVar18,(ulong *)&__range1_3,result);
              }
              std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
              operator++(&__end3_1);
            }
            __gnu_cxx::
            __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
            ::operator++(&__end2_3);
          }
        }
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &total_compressed_length,0);
        StoreBytes(pvVar9,(ulong)(uint)transform_buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (size_t *)&__range1_3,result);
        __range1_3 = (vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                     Round4<unsigned_long>((unsigned_long)__range1_3);
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
        StoreBytes(puVar8,(ulong)compressed_metadata_buf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   (size_t *)&__range1_3,result);
        if ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)*result_length == __range1_3) {
          data_local._7_1_ = 1;
        }
        else {
          fprintf(_stderr,"Mismatch between computed and actual length (%zd vs %zd)\n",
                  *result_length,__range1_3);
          data_local._7_1_ = 0;
        }
      }
LAB_00138a94:
      std::
      map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
      ::~map((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
              *)&__range1_2);
      std::vector<woff2::Table,_std::allocator<woff2::Table>_>::~vector
                ((vector<woff2::Table,_std::allocator<woff2::Table>_> *)
                 &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      puVar11 = (uint8_t *)std::__cxx11::string::data();
      sVar12 = std::__cxx11::string::length();
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      bVar3 = anon_unknown_0::TextCompress
                        (puVar11,sVar12,puVar8,
                         (uint32_t *)
                         ((long)&compressed_metadata_buf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         *(int *)&((font_collection.fonts.
                                    super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->tables)._M_t
                                  ._M_impl.super__Rb_tree_header._M_header._M_left);
      if (bVar3) goto LAB_00137f2d;
      fprintf(_stderr,"Compression of extended metadata failed.\n");
      data_local._7_1_ = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  }
  else {
    fprintf(_stderr,"Compression of combined table failed.\n");
    data_local._7_1_ = 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_compressed_length);
LAB_00138b18:
  FontCollection::~FontCollection((FontCollection *)local_88);
  return (bool)(data_local._7_1_ & 1);
}

Assistant:

bool ConvertTTFToWOFF2(const uint8_t *data, size_t length,
                       uint8_t *result, size_t *result_length,
                       const WOFF2Params& params) {
  FontCollection font_collection;
  if (!ReadFontCollection(data, length, &font_collection)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Parsing of the input font failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

  if (!NormalizeFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (params.allow_transforms && !TransformFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  } else {
    // glyf/loca use 11 to flag "not transformed"
    for (auto& font : font_collection.fonts) {
      Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
      Font::Table* loca_table = font.FindTable(kLocaTableTag);
      if (glyf_table) {
        glyf_table->flag_byte |= 0xc0;
      }
      if (loca_table) {
        loca_table->flag_byte |= 0xc0;
      }
    }
  }

  // Although the compressed size of each table in the final woff2 file won't
  // be larger than its transform_length, we have to allocate a large enough
  // buffer for the compressor, since the compressor can potentially increase
  // the size. If the compressor overflows this, it should return false and
  // then this function will also return false.

  size_t total_transform_length = 0;
  for (const auto& font : font_collection.fonts) {
    total_transform_length += ComputeTotalTransformLength(font);
  }
  size_t compression_buffer_size = CompressedBufferSize(total_transform_length);
  std::vector<uint8_t> compression_buf(compression_buffer_size);
  uint32_t total_compressed_length = compression_buffer_size;

  // Collect all transformed data into one place in output order.
  std::vector<uint8_t> transform_buf(total_transform_length);
  size_t transform_offset = 0;
  for (const auto& font : font_collection.fonts) {
    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& original = font.tables.at(tag);
      if (original.IsReused()) continue;
      if (tag & 0x80808080) continue;
      const Font::Table* table_to_store = font.FindTable(tag ^ 0x80808080);
      if (table_to_store == NULL) table_to_store = &original;

      StoreBytes(table_to_store->data, table_to_store->length,
                 &transform_offset, &transform_buf[0]);
    }
  }

  // Compress all transformed data in one stream.
  if (!Woff2Compress(transform_buf.data(), total_transform_length,
                     &compression_buf[0],
                     &total_compressed_length,
                     params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Compression of combined table failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

#ifdef FONT_COMPRESSION_BIN
  fprintf(stderr, "Compressed %zu to %u.\n", total_transform_length,
          total_compressed_length);
#endif

  // Compress the extended metadata
  // TODO(user): how does this apply to collections
  uint32_t compressed_metadata_buf_length =
    CompressedBufferSize(params.extended_metadata.length());
  std::vector<uint8_t> compressed_metadata_buf(compressed_metadata_buf_length);

  if (params.extended_metadata.length() > 0) {
    if (!TextCompress((const uint8_t*)params.extended_metadata.data(),
                      params.extended_metadata.length(),
                      compressed_metadata_buf.data(),
                      &compressed_metadata_buf_length,
                      params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
      fprintf(stderr, "Compression of extended metadata failed.\n");
#endif
      return FONT_COMPRESSION_FAILURE();
    }
  } else {
    compressed_metadata_buf_length = 0;
  }

  std::vector<Table> tables;
  std::map<std::pair<uint32_t, uint32_t>, uint16_t> index_by_tag_offset;

  for (const auto& font : font_collection.fonts) {

    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& src_table = font.tables.at(tag);
      if (src_table.IsReused()) {
        continue;
      }

      std::pair<uint32_t, uint32_t> tag_offset(src_table.tag, src_table.offset);
      if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
        index_by_tag_offset[tag_offset] = tables.size();
      } else {
        return false;
      }

      Table table;
      table.tag = src_table.tag;
      table.flags = src_table.flag_byte;
      table.src_length = src_table.length;
      table.transform_length = src_table.length;
      const uint8_t* transformed_data = src_table.data;
      const Font::Table* transformed_table =
          font.FindTable(src_table.tag ^ 0x80808080);
      if (transformed_table != NULL) {
        table.flags = transformed_table->flag_byte;
        table.flags |= kWoff2FlagsTransform;
        table.transform_length = transformed_table->length;
        transformed_data = transformed_table->data;

      }
      tables.push_back(table);
    }
  }

  size_t woff2_length = ComputeWoff2Length(font_collection, tables,
      index_by_tag_offset, total_compressed_length,
      compressed_metadata_buf_length);
  if (woff2_length > *result_length) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Result allocation was too small (%zd vs %zd bytes).\n",
           *result_length, woff2_length);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  *result_length = woff2_length;

  size_t offset = 0;

  // start of woff2 header (http://www.w3.org/TR/WOFF2/#woff20Header)
  StoreU32(kWoff2Signature, &offset, result);
  if (font_collection.flavor != kTtcFontFlavor) {
    StoreU32(font_collection.fonts[0].flavor, &offset, result);
  } else {
    StoreU32(kTtcFontFlavor, &offset, result);
  }
  StoreU32(woff2_length, &offset, result);
  Store16(tables.size(), &offset, result);
  Store16(0, &offset, result);  // reserved
  // totalSfntSize
  StoreU32(ComputeUncompressedLength(font_collection), &offset, result);
  StoreU32(total_compressed_length, &offset, result);  // totalCompressedSize

  // Let's just all be v1.0
  Store16(1, &offset, result);  // majorVersion
  Store16(0, &offset, result);  // minorVersion
  if (compressed_metadata_buf_length > 0) {
    StoreU32(woff2_length - compressed_metadata_buf_length,
             &offset, result);  // metaOffset
    StoreU32(compressed_metadata_buf_length, &offset, result);  // metaLength
    StoreU32(params.extended_metadata.length(),
             &offset, result);  // metaOrigLength
  } else {
    StoreU32(0, &offset, result);  // metaOffset
    StoreU32(0, &offset, result);  // metaLength
    StoreU32(0, &offset, result);  // metaOrigLength
  }
  StoreU32(0, &offset, result);  // privOffset
  StoreU32(0, &offset, result);  // privLength
  // end of woff2 header

  // table directory (http://www.w3.org/TR/WOFF2/#table_dir_format)
  for (const auto& table : tables) {
    StoreTableEntry(table, &offset, result);
  }

  // for collections only, collection table directory
  if (font_collection.flavor == kTtcFontFlavor) {
    StoreU32(font_collection.header_version, &offset, result);
    Store255UShort(font_collection.fonts.size(), &offset, result);
    for (const Font& font : font_collection.fonts) {

      uint16_t num_tables = 0;
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables
        num_tables++;
      }
      Store255UShort(num_tables, &offset, result);

      StoreU32(font.flavor, &offset, result);
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables

        // for reused tables, only the original has an updated offset
        uint32_t table_offset =
          table.IsReused() ? table.reuse_of->offset : table.offset;
        uint32_t table_length =
          table.IsReused() ? table.reuse_of->length : table.length;
        std::pair<uint32_t, uint32_t> tag_offset(table.tag, table_offset);
        if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
#ifdef FONT_COMPRESSION_BIN
fprintf(stderr, "Missing table index for offset 0x%08x\n",
                  table_offset);
#endif
          return FONT_COMPRESSION_FAILURE();
        }
        uint16_t index = index_by_tag_offset[tag_offset];
        Store255UShort(index, &offset, result);

      }

    }
  }

  // compressed data format (http://www.w3.org/TR/WOFF2/#table_format)

  StoreBytes(&compression_buf[0], total_compressed_length, &offset, result);
  offset = Round4(offset);

  StoreBytes(compressed_metadata_buf.data(), compressed_metadata_buf_length,
             &offset, result);

  if (*result_length != offset) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Mismatch between computed and actual length "
            "(%zd vs %zd)\n", *result_length, offset);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}